

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  byte bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  rnnenum *prVar6;
  rnnvarset **pprVar7;
  rnnvarset *prVar8;
  char *pcVar9;
  int *piVar10;
  char *name;
  rnnvalue *prVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  byte *pbVar16;
  size_t __n;
  byte *__string;
  byte *pbVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  pcVar9 = vi->prefixstr;
  if (pcVar9 != (char *)0x0) {
    iVar4 = strcmp(pcVar9,"none");
    if (iVar4 == 0) {
      prVar6 = (rnnenum *)0x0;
    }
    else {
      prVar6 = rnn_findenum(db,pcVar9);
    }
    vi->prefenum = prVar6;
  }
  if ((parent != (rnnvarinfo *)0x0) && (0 < parent->varsetsnum)) {
    iVar4 = vi->varsetsnum;
    lVar15 = 0;
    do {
      iVar5 = vi->varsetsmax;
      if (iVar5 <= iVar4) {
        iVar4 = iVar5 * 2;
        if (iVar5 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar7 = (rnnvarset **)realloc(vi->varsets,(long)iVar4 << 3);
        vi->varsets = pprVar7;
      }
      prVar8 = copyvarset(parent->varsets[lVar15]);
      iVar5 = vi->varsetsnum;
      iVar4 = iVar5 + 1;
      vi->varsetsnum = iVar4;
      vi->varsets[iVar5] = prVar8;
      lVar15 = lVar15 + 1;
    } while (lVar15 < parent->varsetsnum);
  }
  pcVar9 = vi->varsetstr;
  prVar6 = vi->prefenum;
  if (((prVar6 == (rnnenum *)0x0) && (parent != (rnnvarinfo *)0x0)) && (pcVar9 == (char *)0x0)) {
    if (parent->varsetstr == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = strdup(parent->varsetstr);
    }
    vi->varsetstr = pcVar9;
  }
  if (pcVar9 != (char *)0x0) {
    prVar6 = rnn_findenum(db,pcVar9);
  }
  __string = (byte *)vi->variantsstr;
  if (__string != (byte *)0x0) {
    if (prVar6 == (rnnenum *)0x0) {
      fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
      db->estatus = 1;
      return;
    }
    uVar2 = prVar6->valsnum;
    iVar4 = vi->varsetsnum;
    if (0 < (long)iVar4) {
      lVar15 = 0;
      do {
        prVar8 = vi->varsets[lVar15];
        if (prVar8->venum == prVar6) goto LAB_00104bdc;
        lVar15 = lVar15 + 1;
      } while (iVar4 != lVar15);
    }
    prVar8 = (rnnvarset *)calloc(0x10,1);
    prVar8->venum = prVar6;
    piVar10 = (int *)calloc(4,(long)(int)uVar2);
    prVar8->variants = piVar10;
    auVar3 = _DAT_00106040;
    if (0 < (int)uVar2) {
      lVar15 = (ulong)uVar2 - 1;
      auVar19._8_4_ = (int)lVar15;
      auVar19._0_8_ = lVar15;
      auVar19._12_4_ = (int)((ulong)lVar15 >> 0x20);
      lVar15 = 0;
      auVar19 = auVar19 ^ _DAT_00106040;
      auVar20 = _DAT_00106020;
      auVar21 = _DAT_00106030;
      do {
        auVar22 = auVar21 ^ auVar3;
        iVar5 = auVar19._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar5 && auVar19._0_4_ < auVar22._0_4_ ||
                    iVar5 < auVar22._4_4_) & 1)) {
          *(undefined4 *)((long)piVar10 + lVar15) = 1;
        }
        if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
            auVar22._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)piVar10 + lVar15 + 4) = 1;
        }
        auVar22 = auVar20 ^ auVar3;
        iVar23 = auVar22._4_4_;
        if (iVar23 <= iVar5 && (iVar23 != iVar5 || auVar22._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)piVar10 + lVar15 + 8) = 1;
          *(undefined4 *)((long)piVar10 + lVar15 + 0xc) = 1;
        }
        lVar14 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar14 + 4;
        lVar14 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar14 + 4;
        lVar15 = lVar15 + 0x10;
      } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar15);
    }
    iVar5 = vi->varsetsmax;
    if (iVar4 < iVar5) {
      pprVar7 = vi->varsets;
    }
    else {
      iVar4 = 0x10;
      if (iVar5 != 0) {
        iVar4 = iVar5 * 2;
      }
      vi->varsetsmax = iVar4;
      pprVar7 = (rnnvarset **)realloc(vi->varsets,(long)iVar4 << 3);
      vi->varsets = pprVar7;
      iVar4 = vi->varsetsnum;
    }
    vi->varsetsnum = iVar4 + 1;
    pprVar7[iVar4] = prVar8;
LAB_00104bdc:
    while( true ) {
      for (; bVar1 = *__string, bVar1 == 0x20; __string = __string + 1) {
      }
      pbVar16 = __string;
      pbVar17 = __string;
      if (bVar1 == 0) break;
      while( true ) {
        pbVar17 = pbVar17 + 1;
        if ((bVar1 < 0x3b) && ((0x400200100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
        bVar1 = pbVar16[1];
        pbVar16 = pbVar16 + 1;
      }
      if ((long)pbVar16 - (long)__string == 0) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = strndup((char *)__string,(long)pbVar16 - (long)__string);
      }
      if ((bVar1 & 0xdf) == 0) {
        iVar4 = findvidx(db,prVar6,pcVar9);
        __string = pbVar16;
        if (iVar4 != -1) {
          prVar8->variants[iVar4] = prVar8->variants[iVar4] | 2;
        }
      }
      else {
        __n = 0;
        for (; (*pbVar17 & 0xdf) != 0; pbVar17 = pbVar17 + 1) {
          __n = __n + 1;
        }
        if (__n == 0) {
          name = (char *)0x0;
        }
        else {
          name = strndup((char *)(pbVar16 + 1),__n);
        }
        if (pcVar9 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar4 = findvidx(db,prVar6,pcVar9);
        }
        uVar12 = uVar2;
        if (name != (char *)0x0) {
          iVar5 = findvidx(db,prVar6,name);
          uVar12 = (uint)(*pbVar16 == 0x2d) + iVar5;
        }
        if (((iVar4 != -1) && (uVar12 != 0xffffffff)) && (iVar4 < (int)uVar12)) {
          piVar10 = prVar8->variants;
          lVar15 = (long)iVar4;
          do {
            *(byte *)(piVar10 + lVar15) = *(byte *)(piVar10 + lVar15) | 2;
            lVar15 = lVar15 + 1;
          } while ((int)uVar12 != lVar15);
        }
        free(name);
        __string = pbVar17;
      }
      free(pcVar9);
    }
    vi->dead = 1;
    if (0 < (int)uVar2) {
      piVar10 = prVar8->variants;
      uVar13 = 0;
      do {
        bVar18 = piVar10[uVar13] == 3;
        piVar10[uVar13] = (uint)bVar18;
        if (bVar18) {
          vi->dead = 0;
        }
        uVar13 = uVar13 + 1;
      } while (uVar2 != uVar13);
    }
  }
  if (vi->dead != 0) {
    return;
  }
  prVar6 = vi->prefenum;
  if (prVar6 == (rnnenum *)0x0) {
    return;
  }
  if (0 < (long)vi->varsetsnum) {
    lVar15 = 0;
    do {
      if (vi->varsets[lVar15]->venum == prVar6) {
        if ((long)prVar6->valsnum < 1) {
          return;
        }
        lVar14 = 0;
        while (vi->varsets[lVar15]->variants[lVar14] == 0) {
          lVar14 = lVar14 + 1;
          if (prVar6->valsnum == lVar14) {
            return;
          }
        }
        prVar11 = prVar6->vals[lVar14];
        goto LAB_00104d8a;
      }
      lVar15 = lVar15 + 1;
    } while (vi->varsetsnum != lVar15);
  }
  prVar11 = *prVar6->vals;
LAB_00104d8a:
  pcVar9 = strdup(prVar11->name);
  vi->prefix = pcVar9;
  return;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr ? strdup(parent->varsetstr) : NULL;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = strdup(vi->prefenum->vals[i]->name);
					return;
				}
		} else {
			vi->prefix = strdup(vi->prefenum->vals[0]->name);
		}
	}
}